

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void free(void *__ptr)

{
  ulong uVar1;
  malloc_tree_chunk *pmVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  malloc_tree_chunk **ppmVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  malloc_tree_chunk *pmVar10;
  byte bVar11;
  uint uVar12;
  tbinptr pmVar13;
  tbinptr pmVar14;
  tbinptr pmVar15;
  long lVar16;
  tbinptr pmVar17;
  mstate m;
  tbinptr pmVar18;
  malloc_tree_chunk **ppmVar19;
  size_t __len;
  bool bVar20;
  
  if (__ptr == (void *)0x0) {
    return;
  }
  pmVar15 = (tbinptr)((long)__ptr - 0x10);
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar20 = _gm_.mutex != 0;
    _gm_.mutex = 1;
    if (bVar20) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  if ((pmVar15 < _gm_.least_addr) || (uVar9 = *(ulong *)((long)__ptr + -8), ((uint)uVar9 & 3) == 1))
  goto LAB_00105935;
  sVar8 = uVar9 & 0xfffffffffffffff8;
  pmVar14 = (tbinptr)((long)&pmVar15->prev_foot + sVar8);
  if ((uVar9 & 1) != 0) goto LAB_001054b7;
  uVar1 = pmVar15->prev_foot;
  if ((uVar9 & 2) == 0) {
    __len = sVar8 + uVar1 + 0x20;
    iVar7 = munmap((void *)((long)pmVar15 - uVar1),__len);
    sVar8 = _gm_.dvsize;
    if (iVar7 == 0) {
      _gm_.footprint = _gm_.footprint - __len;
    }
    goto LAB_0010590d;
  }
  pmVar15 = (tbinptr)((long)pmVar15 - uVar1);
  if (pmVar15 < _gm_.least_addr) goto LAB_00105935;
  sVar8 = sVar8 + uVar1;
  if (pmVar15 == (tbinptr)_gm_.dv) {
    if ((~(uint)pmVar14->head & 3) == 0) {
      _gm_.dvsize = sVar8;
      pmVar14->head = pmVar14->head & 0xfffffffffffffffe;
      pmVar15->head = sVar8 | 1;
      pmVar14->prev_foot = sVar8;
      sVar8 = _gm_.dvsize;
      goto LAB_0010590d;
    }
  }
  else if (uVar1 < 0x100) {
    pmVar10 = pmVar15->fd;
    pmVar2 = pmVar15->bk;
    if ((pmVar10 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
       ((pmVar10 < _gm_.least_addr || (pmVar10->bk != pmVar15)))) goto LAB_00105935;
    if (pmVar2 == pmVar10) {
      bVar11 = (byte)(uVar1 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
    }
    else {
      if ((pmVar2 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar1 >> 3) * 2)) &&
         ((pmVar2 < _gm_.least_addr || (pmVar2->fd != pmVar15)))) goto LAB_00105935;
      pmVar10->bk = pmVar2;
      pmVar2->fd = pmVar10;
    }
  }
  else {
    pmVar17 = pmVar15->bk;
    pmVar10 = pmVar15->child[2];
    if (pmVar17 == pmVar15) {
      if (pmVar15->child[1] == (tbinptr)0x0) {
        if (pmVar15->child[0] == (tbinptr)0x0) {
          pmVar17 = (tbinptr)0x0;
          goto LAB_00105417;
        }
        pmVar13 = pmVar15->child[0];
        ppmVar6 = pmVar15->child;
      }
      else {
        pmVar13 = pmVar15->child[1];
        ppmVar6 = pmVar15->child + 1;
      }
      do {
        do {
          ppmVar19 = ppmVar6;
          pmVar17 = pmVar13;
          pmVar13 = pmVar17->child[1];
          ppmVar6 = pmVar17->child + 1;
        } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
        pmVar13 = pmVar17->child[0];
        ppmVar6 = pmVar17->child;
      } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar19 < _gm_.least_addr) goto LAB_00105935;
      *ppmVar19 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar2 = pmVar15->fd;
      if (((pmVar2 < _gm_.least_addr) || (pmVar2->bk != pmVar15)) || (pmVar17->fd != pmVar15))
      goto LAB_00105935;
      pmVar2->bk = pmVar17;
      pmVar17->fd = pmVar2;
    }
LAB_00105417:
    if (pmVar10 != (malloc_tree_chunk *)0x0) {
      uVar12 = *(uint *)(pmVar15->child + 3);
      if (pmVar15 == _gm_.treebins[uVar12]) {
        _gm_.treebins[uVar12] = pmVar17;
        if (pmVar17 == (tbinptr)0x0) {
          bVar11 = (byte)uVar12 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        }
        else {
LAB_00105463:
          pcVar5 = _gm_.least_addr;
          if (pmVar17 < _gm_.least_addr) goto LAB_00105935;
          pmVar17->child[2] = pmVar10;
          pmVar10 = pmVar15->child[0];
          if (pmVar10 != (malloc_tree_chunk *)0x0) {
            if (pmVar10 < pcVar5) goto LAB_00105935;
            pmVar17->child[0] = pmVar10;
            pmVar10->parent = pmVar17;
          }
          pmVar10 = pmVar15->child[1];
          if (pmVar10 != (malloc_tree_chunk *)0x0) {
            if (pmVar10 < pcVar5) goto LAB_00105935;
            pmVar17->child[1] = pmVar10;
            pmVar10->parent = pmVar17;
          }
        }
      }
      else {
        if (pmVar10 < _gm_.least_addr) goto LAB_00105935;
        pmVar10->child[pmVar10->child[0] != pmVar15] = pmVar17;
        if (pmVar17 != (tbinptr)0x0) goto LAB_00105463;
      }
    }
  }
LAB_001054b7:
  if ((pmVar14 <= pmVar15) || (uVar9 = pmVar14->head, (uVar9 & 1) == 0)) goto LAB_00105935;
  if ((uVar9 & 2) == 0) {
    if (pmVar14 == (tbinptr)_gm_.top) {
      uVar9 = sVar8 + _gm_.topsize;
      _gm_.topsize = uVar9;
      _gm_.top = (mchunkptr)pmVar15;
      pmVar15->head = uVar9 | 1;
      if (pmVar15 == (tbinptr)_gm_.dv) {
        _gm_.dv = (mchunkptr)0x0;
        _gm_.dvsize = 0;
      }
      sVar8 = _gm_.dvsize;
      if (_gm_.trim_check < uVar9) {
        sys_trim((mstate)0x0,0xfffffffffffffffe);
        sVar8 = _gm_.dvsize;
      }
      goto LAB_0010590d;
    }
    if (pmVar14 == (tbinptr)_gm_.dv) {
      uVar9 = sVar8 + _gm_.dvsize;
      _gm_.dvsize = uVar9;
      _gm_.dv = (mchunkptr)pmVar15;
      pmVar15->head = uVar9 | 1;
      *(ulong *)((long)&pmVar15->prev_foot + uVar9) = uVar9;
      sVar8 = _gm_.dvsize;
      goto LAB_0010590d;
    }
    if (uVar9 < 0x100) {
      pmVar10 = pmVar14->fd;
      pmVar2 = pmVar14->bk;
      if ((pmVar10 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar9 >> 3) * 2)) &&
         ((pmVar10 < _gm_.least_addr || (pmVar10->bk != pmVar14)))) goto LAB_00105935;
      if (pmVar2 == pmVar10) {
        bVar11 = (byte)(uVar9 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar2 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar9 >> 3) * 2)) &&
           ((pmVar2 < _gm_.least_addr || (pmVar2->fd != pmVar14)))) goto LAB_00105935;
        pmVar10->bk = pmVar2;
        pmVar2->fd = pmVar10;
      }
    }
    else {
      pmVar17 = pmVar14->bk;
      pmVar10 = pmVar14->child[2];
      if (pmVar17 == pmVar14) {
        if (pmVar14->child[1] == (tbinptr)0x0) {
          if (pmVar14->child[0] == (tbinptr)0x0) {
            pmVar17 = (tbinptr)0x0;
            goto LAB_0010584d;
          }
          pmVar13 = pmVar14->child[0];
          ppmVar6 = pmVar14->child;
        }
        else {
          pmVar13 = pmVar14->child[1];
          ppmVar6 = pmVar14->child + 1;
        }
        do {
          do {
            ppmVar19 = ppmVar6;
            pmVar17 = pmVar13;
            pmVar13 = pmVar17->child[1];
            ppmVar6 = pmVar17->child + 1;
          } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
          pmVar13 = pmVar17->child[0];
          ppmVar6 = pmVar17->child;
        } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar19 < _gm_.least_addr) goto LAB_00105935;
        *ppmVar19 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar2 = pmVar14->fd;
        if (((pmVar2 < _gm_.least_addr) || (pmVar2->bk != pmVar14)) || (pmVar17->fd != pmVar14))
        goto LAB_00105935;
        pmVar2->bk = pmVar17;
        pmVar17->fd = pmVar2;
      }
LAB_0010584d:
      if (pmVar10 != (malloc_tree_chunk *)0x0) {
        uVar12 = *(uint *)(pmVar14->child + 3);
        if (pmVar14 == _gm_.treebins[uVar12]) {
          _gm_.treebins[uVar12] = pmVar17;
          if (pmVar17 == (tbinptr)0x0) {
            bVar11 = (byte)uVar12 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
          }
          else {
LAB_00105899:
            pcVar5 = _gm_.least_addr;
            if (pmVar17 < _gm_.least_addr) goto LAB_00105935;
            pmVar17->child[2] = pmVar10;
            pmVar10 = pmVar14->child[0];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < pcVar5) goto LAB_00105935;
              pmVar17->child[0] = pmVar10;
              pmVar10->parent = pmVar17;
            }
            pmVar10 = pmVar14->child[1];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < pcVar5) goto LAB_00105935;
              pmVar17->child[1] = pmVar10;
              pmVar10->parent = pmVar17;
            }
          }
        }
        else {
          if (pmVar10 < _gm_.least_addr) goto LAB_00105935;
          pmVar10->child[pmVar10->child[0] != pmVar14] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) goto LAB_00105899;
        }
      }
    }
    sVar8 = sVar8 + (uVar9 & 0xfffffffffffffff8);
    pmVar15->head = sVar8 | 1;
    *(size_t *)((long)&pmVar15->prev_foot + sVar8) = sVar8;
    if (pmVar15 == (tbinptr)_gm_.dv) goto LAB_0010590d;
  }
  else {
    pmVar14->head = uVar9 & 0xfffffffffffffffe;
    pmVar15->head = sVar8 | 1;
    *(size_t *)((long)&pmVar15->prev_foot + sVar8) = sVar8;
  }
  if (sVar8 < 0x100) {
    uVar9 = sVar8 >> 3;
    if ((_gm_.smallmap >> ((uint)uVar9 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar9 & 0x1f);
      pmVar10 = (malloc_tree_chunk *)(_gm_.smallbins + uVar9 * 2);
    }
    else {
      pmVar10 = (malloc_tree_chunk *)_gm_.smallbins[uVar9 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar9 * 2 + 2] < _gm_.least_addr) {
LAB_00105935:
        abort();
      }
    }
    _gm_.smallbins[uVar9 * 2 + 2] = (mchunkptr)pmVar15;
    pmVar10->bk = pmVar15;
    pmVar15->fd = pmVar10;
    pmVar15->bk = (malloc_tree_chunk *)(_gm_.smallbins + uVar9 * 2);
    sVar8 = _gm_.dvsize;
  }
  else {
    uVar12 = (uint)(sVar8 >> 8);
    if (uVar12 == 0) {
      uVar12 = 0;
    }
    else if (uVar12 < 0x10000) {
      uVar3 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar12 = (uint)((sVar8 >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1) != 0) +
               (uVar3 ^ 0x1f) * 2 ^ 0x3e;
    }
    else {
      uVar12 = 0x1f;
    }
    pmVar14 = (tbinptr)(_gm_.treebins + uVar12);
    *(uint *)(pmVar15->child + 3) = uVar12;
    pmVar15->child[0] = (malloc_tree_chunk *)0x0;
    pmVar15->child[1] = (malloc_tree_chunk *)0x0;
    if ((_gm_.treemap >> (uVar12 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar17 = pmVar14;
    }
    else {
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar16 = sVar8 << (bVar11 & 0x3f);
      pmVar14 = (tbinptr)pmVar14->prev_foot;
      do {
        pmVar13 = pmVar14;
        if ((pmVar13->head & 0xfffffffffffffff8) == sVar8) {
          if ((pmVar13 < _gm_.least_addr) || (pmVar17 = pmVar13->fd, pmVar17 < _gm_.least_addr))
          goto LAB_00105935;
          pmVar14 = (tbinptr)&pmVar13->fd;
          pmVar17->bk = pmVar15;
          lVar16 = 0x30;
          m = (mstate)&DAT_00000010;
          pmVar18 = (tbinptr)0x0;
          goto LAB_001057c9;
        }
        lVar4 = lVar16 >> 0x3f;
        lVar16 = lVar16 * 2;
        pmVar14 = *(tbinptr *)((long)pmVar13 + lVar4 * -8 + 0x20);
      } while (pmVar14 != (tbinptr)0x0);
      pmVar14 = (tbinptr)((long)pmVar13 + lVar4 * -8 + 0x20);
      pmVar17 = pmVar13;
      if (pmVar14 < _gm_.least_addr) goto LAB_00105935;
    }
    m = (mstate)&DAT_00000030;
    lVar16 = 0x10;
    pmVar13 = pmVar15;
    pmVar18 = pmVar15;
LAB_001057c9:
    pmVar14->prev_foot = (size_t)pmVar15;
    *(tbinptr *)((long)m->smallbins + (long)(pmVar15[-2].child + 3)) = pmVar17;
    pmVar15->bk = pmVar13;
    *(tbinptr *)((long)&pmVar15->prev_foot + lVar16) = pmVar18;
    _gm_.release_checks = _gm_.release_checks - 1;
    sVar8 = _gm_.dvsize;
    if (_gm_.release_checks == 0) {
      release_unused_segments(m);
      sVar8 = _gm_.dvsize;
    }
  }
LAB_0010590d:
  _gm_.dvsize = sVar8;
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return;
}

Assistant:

void dlfree(void* mem) {
  /*
     Consolidate freed chunks with preceeding or succeeding bordering
     free chunks, if they exist, and then place in a bin.  Intermixed
     with special cases for top, dv, mmapped chunks, and usage errors.
  */

  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
#else /* FOOTERS */
#define fm gm
#endif /* FOOTERS */
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
#if !FOOTERS
#undef fm
#endif /* FOOTERS */
}